

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleSubstringCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream ostr;
  string local_1c0;
  string local_1a0 [11];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0xa0) {
    iVar2 = atoi(pbVar1[2]._M_dataplus._M_p);
    iVar3 = atoi(pbVar1[3]._M_dataplus._M_p);
    if (iVar2 < 0 || (int)pbVar1[1]._M_string_length < iVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      poVar4 = std::operator<<((ostream *)local_1a0,"begin index: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," is out of range 0 - ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
    }
    else {
      if (-2 < iVar3) {
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::substr((ulong)local_1a0,(ulong)(pbVar1 + 1));
        cmMakefile::AddDefinition(this_00,pbVar1 + 4,local_1a0[0]._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)local_1a0);
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      poVar4 = std::operator<<((ostream *)local_1a0,"end index: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4," should be -1 or greater");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
    }
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  else {
    std::__cxx11::string::string
              ((string *)local_1a0,"sub-command SUBSTRING requires four arguments.",
               (allocator *)&local_1c0);
    cmCommand::SetError(&this->super_cmCommand,local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
  }
  return false;
}

Assistant:

bool cmStringCommand::HandleSubstringCommand(std::vector<std::string> const&
                                             args)
{
  if(args.size() != 5)
    {
    this->SetError("sub-command SUBSTRING requires four arguments.");
    return false;
    }

  const std::string& stringValue = args[1];
  int begin = atoi(args[2].c_str());
  int end = atoi(args[3].c_str());
  const std::string& variableName = args[4];

  size_t stringLength = stringValue.size();
  int intStringLength = static_cast<int>(stringLength);
  if ( begin < 0 || begin > intStringLength )
    {
    std::ostringstream ostr;
    ostr << "begin index: " << begin << " is out of range 0 - "
         << stringLength;
    this->SetError(ostr.str());
    return false;
    }
  if ( end < -1 )
    {
    std::ostringstream ostr;
    ostr << "end index: " << end << " should be -1 or greater";
    this->SetError(ostr.str());
    return false;
    }

  this->Makefile->AddDefinition(variableName,
                                stringValue.substr(begin, end).c_str());
  return true;
}